

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar67;
  int iVar68;
  uint uVar69;
  ulong in_RAX;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  secp256k1_strauss_point_state *psVar70;
  ulong uVar71;
  uint uVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  secp256k1_gej *psVar77;
  uint64_t *puVar78;
  ulong uVar79;
  secp256k1_gej *psVar80;
  secp256k1_ge *psVar81;
  long lVar82;
  ulong uVar83;
  secp256k1_fe *psVar84;
  long lVar85;
  long lVar86;
  bool bVar87;
  byte bVar88;
  undefined1 auVar89 [16];
  secp256k1_scalar na_lam;
  secp256k1_fe Z;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  long local_588;
  long local_580;
  long local_578;
  undefined1 local_538 [64];
  long lStack_4f8;
  uint64_t local_4f0;
  int local_4e8;
  undefined1 local_4b8 [16];
  ulong uStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [28];
  uint uStack_44c;
  secp256k1_scalar local_448 [16];
  uint uStack_23c;
  secp256k1_gej local_238 [4];
  
  bVar88 = 0;
  local_4b8._0_8_ = 1;
  stack0xfffffffffffffb50 = (undefined1  [16])0x0;
  local_4a0 = (undefined1  [16])0x0;
  if (num == 0) {
    uVar72 = 0;
    lVar75 = 0;
    bVar87 = true;
  }
  else {
    psVar84 = &a->z;
    lVar75 = 0;
    uVar72 = 0;
    do {
      auVar89._0_4_ = -(uint)((int)na->d[2] == 0 && (int)na->d[0] == 0);
      auVar89._4_4_ = -(uint)(*(int *)((long)na->d + 0x14) == 0 && *(int *)((long)na->d + 4) == 0);
      auVar89._8_4_ = -(uint)((int)na->d[3] == 0 && (int)na->d[1] == 0);
      auVar89._12_4_ =
           -(uint)(*(int *)((long)na->d + 0x1c) == 0 && *(int *)((long)na->d + 0xc) == 0);
      uVar67 = movmskps((int)in_RAX,auVar89);
      in_RAX = (ulong)(uVar67 ^ 0xf);
      if (((uVar67 ^ 0xf) != 0) && (*(int *)(psVar84 + 1) == 0)) {
        secp256k1_scalar_split_lambda(local_448,(secp256k1_scalar *)local_538,na);
        iVar68 = secp256k1_ecmult_wnaf(state->ps[lVar75].wnaf_na_1,0x81,local_448,5);
        psVar70 = state->ps;
        psVar70[lVar75].bits_na_1 = iVar68;
        uVar69 = secp256k1_ecmult_wnaf
                           (psVar70[lVar75].wnaf_na_lam,0x81,(secp256k1_scalar *)local_538,5);
        psVar70 = state->ps;
        psVar70[lVar75].bits_na_lam = uVar69;
        uVar67 = psVar70[lVar75].bits_na_1;
        if ((int)uVar72 < (int)uVar67) {
          uVar72 = uVar67;
        }
        if ((int)uVar72 < (int)uVar69) {
          uVar72 = uVar69;
        }
        psVar77 = (secp256k1_gej *)(psVar84 + -2);
        psVar80 = local_238;
        for (lVar73 = 0x10; lVar73 != 0; lVar73 = lVar73 + -1) {
          (psVar80->x).n[0] = (psVar77->x).n[0];
          psVar77 = (secp256k1_gej *)((long)psVar77 + (ulong)bVar88 * -0x10 + 8);
          psVar80 = (secp256k1_gej *)((long)psVar80 + (ulong)bVar88 * -0x10 + 8);
        }
        if (lVar75 != 0) {
          secp256k1_gej_rescale(local_238,(secp256k1_fe *)local_4b8);
        }
        secp256k1_ecmult_odd_multiples_table
                  (8,state->pre_a + lVar75 * 8,state->aux + lVar75 * 8,(secp256k1_fe *)local_4b8,
                   local_238);
        in_RAX = extraout_RAX;
        if (lVar75 != 0) {
          secp256k1_fe_impl_mul(state->aux + lVar75 * 8,state->aux + lVar75 * 8,psVar84);
          in_RAX = extraout_RAX_00;
        }
        lVar75 = lVar75 + 1;
      }
      psVar84 = (secp256k1_fe *)((long)(psVar84 + 3) + 8);
      na = na + 1;
      num = num - 1;
    } while (num != 0);
    bVar87 = lVar75 == 0;
    if (bVar87) {
      lVar75 = 0;
      bVar87 = true;
    }
    else {
      secp256k1_ge_table_set_globalz(lVar75 * 8,state->pre_a,state->aux);
      lVar82 = 0;
      lVar86 = 0;
      lVar73 = 0;
      do {
        lVar76 = 0;
        lVar85 = lVar86;
        do {
          secp256k1_fe_impl_mul
                    ((secp256k1_fe *)((long)state->aux->n + lVar76 + lVar82),
                     (secp256k1_fe *)((long)(state->pre_a->x).n + lVar85),&secp256k1_const_beta);
          lVar85 = lVar85 + 0x58;
          lVar76 = lVar76 + 0x28;
        } while (lVar76 != 0x140);
        lVar73 = lVar73 + 1;
        lVar86 = lVar86 + 0x2c0;
        lVar82 = lVar82 + 0x140;
      } while (lVar73 != lVar75);
    }
  }
  if (ng == (secp256k1_scalar *)0x0) {
    local_580 = 0;
    local_578 = 0;
  }
  else {
    local_468._0_8_ = ng->d[0];
    local_468._8_8_ = ng->d[1];
    stack0xfffffffffffffba8 = (undefined1  [16])0x0;
    local_488 = *(undefined1 (*) [16])(ng->d + 2);
    local_478 = (undefined1  [16])0x0;
    uVar67 = secp256k1_ecmult_wnaf((int *)local_238,0x81,(secp256k1_scalar *)local_468,0xf);
    uVar69 = secp256k1_ecmult_wnaf((int *)local_448,0x81,(secp256k1_scalar *)local_488,0xf);
    if ((int)uVar72 < (int)uVar67) {
      uVar72 = uVar67;
    }
    if ((int)uVar72 < (int)uVar69) {
      uVar72 = uVar69;
    }
    local_578 = (long)(int)uVar69;
    local_580 = (long)(int)uVar67;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (0 < (int)uVar72) {
    local_588 = (ulong)uVar72 * 4;
    uVar79 = (ulong)uVar72;
    do {
      local_588 = local_588 + -4;
      if (r->infinity == 0) {
        secp256k1_gej_double(r,r);
      }
      else {
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
      }
      if (!bVar87) {
        lVar85 = 0x40c;
        lVar76 = 0;
        lVar86 = 0;
        lVar73 = local_588;
        lVar82 = lVar75;
        do {
          psVar70 = state->ps;
          if (((long)uVar79 <= (long)*(int *)((long)psVar70->wnaf_na_1 + lVar85 + -4)) &&
             (uVar72 = *(uint *)((long)psVar70->wnaf_na_1 + lVar73), uVar72 != 0)) {
            if ((int)uVar72 < 1) {
              puVar78 = (uint64_t *)((long)state->pre_a[~uVar72 >> 1].x.n + lVar86);
              psVar81 = (secp256k1_ge *)local_538;
              for (lVar74 = 0xb; lVar74 != 0; lVar74 = lVar74 + -1) {
                (psVar81->x).n[0] = *puVar78;
                puVar78 = puVar78 + (ulong)bVar88 * -2 + 1;
                psVar81 = (secp256k1_ge *)((long)psVar81 + (ulong)bVar88 * -0x10 + 8);
              }
              local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
              local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
              lVar74 = local_538._56_8_;
              lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
              local_538._56_8_ = 0x3ffffffffffffc - lVar74;
              local_4f0 = 0x3fffffffffffc - local_4f0;
            }
            else {
              puVar78 = (uint64_t *)((long)state->pre_a[uVar72 - 1 >> 1].x.n + lVar86);
              psVar81 = (secp256k1_ge *)local_538;
              for (lVar74 = 0xb; lVar74 != 0; lVar74 = lVar74 + -1) {
                (psVar81->x).n[0] = *puVar78;
                puVar78 = puVar78 + (ulong)bVar88 * -2 + 1;
                psVar81 = (secp256k1_ge *)((long)psVar81 + (ulong)bVar88 * -0x10 + 8);
              }
            }
            secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)local_538,(secp256k1_fe *)0x0);
            psVar70 = state->ps;
          }
          if (((long)uVar79 <= (long)*(int *)((long)psVar70->wnaf_na_1 + lVar85)) &&
             (uVar72 = *(uint *)((long)psVar70->wnaf_na_lam + lVar73), uVar72 != 0)) {
            psVar84 = state->aux;
            psVar81 = state->pre_a;
            local_4e8 = 0;
            if ((int)uVar72 < 1) {
              uVar72 = ~uVar72 >> 1;
              local_538._32_8_ = *(uint64_t *)((long)psVar84[uVar72].n + lVar76 + 0x20);
              puVar78 = (uint64_t *)((long)psVar84[uVar72].n + lVar76);
              local_538._0_8_ = *puVar78;
              local_538._8_8_ = puVar78[1];
              puVar78 = (uint64_t *)((long)psVar84[uVar72].n + lVar76 + 0x10);
              local_538._16_8_ = *puVar78;
              local_538._24_8_ = puVar78[1];
              plVar1 = (long *)((long)psVar81[uVar72].y.n + lVar86);
              plVar2 = (long *)((long)psVar81[uVar72].y.n + lVar86 + 0x10);
              local_538._40_8_ = 0x3ffffbfffff0bc - *plVar1;
              local_538._48_8_ = 0x3ffffffffffffc - plVar1[1];
              lStack_4f8 = 0x3ffffffffffffc - plVar2[1];
              local_538._56_8_ = 0x3ffffffffffffc - *plVar2;
              local_4f0 = 0x3fffffffffffc - *(long *)((long)psVar81[uVar72].y.n + lVar86 + 0x20);
            }
            else {
              uVar72 = uVar72 - 1 >> 1;
              local_538._32_8_ = *(uint64_t *)((long)psVar84[uVar72].n + lVar76 + 0x20);
              puVar78 = (uint64_t *)((long)psVar84[uVar72].n + lVar76);
              local_538._0_8_ = *puVar78;
              local_538._8_8_ = puVar78[1];
              puVar78 = (uint64_t *)((long)psVar84[uVar72].n + lVar76 + 0x10);
              local_538._16_8_ = *puVar78;
              local_538._24_8_ = puVar78[1];
              local_4f0 = *(uint64_t *)((long)psVar81[uVar72].y.n + lVar86 + 0x20);
              puVar78 = (uint64_t *)((long)psVar81[uVar72].y.n + lVar86);
              local_538._40_8_ = *puVar78;
              local_538._48_8_ = puVar78[1];
              unique0x00006c80 = *(undefined1 (*) [16])((long)psVar81[uVar72].y.n + lVar86 + 0x10);
            }
            secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)local_538,(secp256k1_fe *)0x0);
          }
          lVar73 = lVar73 + 0x410;
          lVar85 = lVar85 + 0x410;
          lVar86 = lVar86 + 0x2c0;
          lVar76 = lVar76 + 0x140;
          lVar82 = lVar82 + -1;
        } while (lVar82 != 0);
      }
      if (((long)uVar79 <= local_580) &&
         (uVar72 = *(uint *)((long)local_238[0].x.n + uVar79 * 4 + -4), uVar72 != 0)) {
        if ((int)uVar72 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g + (~uVar72 >> 1));
          local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
          local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
          lVar73 = local_538._56_8_;
          lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
          local_538._56_8_ = 0x3ffffffffffffc - lVar73;
          local_4f0 = 0x3fffffffffffc - local_4f0;
        }
        else {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g + (uVar72 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)local_538,(secp256k1_fe *)local_4b8);
      }
      if (((long)uVar79 <= local_578) &&
         (uVar72 = *(uint *)((long)local_448[0].d + uVar79 * 4 + -4), uVar72 != 0)) {
        if ((int)uVar72 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g_128 + (~uVar72 >> 1));
          local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
          local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
          lVar73 = local_538._56_8_;
          lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
          local_538._56_8_ = 0x3ffffffffffffc - lVar73;
          local_4f0 = 0x3fffffffffffc - local_4f0;
        }
        else {
          secp256k1_ge_from_storage
                    ((secp256k1_ge *)local_538,secp256k1_pre_g_128 + (uVar72 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)local_538,(secp256k1_fe *)local_4b8);
      }
      bVar7 = 1 < (long)uVar79;
      uVar79 = uVar79 - 1;
    } while (bVar7);
    if (r->infinity == 0) {
      uVar79 = (r->z).n[0];
      uVar3 = (r->z).n[1];
      uVar4 = (r->z).n[2];
      uVar5 = (r->z).n[3];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_4a0._0_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar79;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uStack_4a8;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar3;
      uVar6 = (r->z).n[4];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_4b8._8_8_;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar4;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_4b8._0_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar5;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_4a0._8_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar6;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = SUB168(auVar12 * auVar43,0);
      auVar10 = auVar9 * auVar40 + auVar8 * auVar39 + auVar10 * auVar41 + auVar11 * auVar42 +
                auVar13 * ZEXT816(0x1000003d10);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_4a0._8_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar79;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_4a0._0_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar3;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uStack_4a8;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar4;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_4b8._8_8_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar5;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_4b8._0_8_;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar6;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = SUB168(auVar12 * auVar43,8);
      auVar89 = auVar19 * ZEXT816(0x1000003d10000) +
                auVar18 * auVar48 + auVar17 * auVar47 + auVar16 * auVar46 + auVar15 * auVar45 +
                auVar14 * auVar44 + (auVar10 >> 0x34);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_4b8._0_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar79;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_4a0._8_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar3;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_4a0._0_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar4;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uStack_4a8;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar5;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_4b8._8_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar6;
      auVar8 = auVar24 * auVar53 + auVar23 * auVar52 + auVar22 * auVar51 + auVar21 * auVar50 +
               (auVar89 >> 0x34);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar89._6_2_ & 0xf);
      auVar9 = auVar25 * ZEXT816(0x1000003d1) + auVar20 * auVar49;
      uVar71 = auVar9._0_8_;
      uVar83 = auVar9._8_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_4b8._8_8_;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar79;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_4b8._0_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar3;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_4a0._8_8_;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar4;
      auVar64._8_8_ = uVar83 >> 0x34;
      auVar64._0_8_ = uVar83 * 0x1000 | uVar71 >> 0x34;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_4a0._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar5;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uStack_4a8;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar6;
      auVar8 = auVar28 * auVar56 + auVar30 * auVar58 + auVar29 * auVar57 + (auVar8 >> 0x34);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
      auVar64 = auVar31 * ZEXT816(0x1000003d10) + auVar27 * auVar55 + auVar26 * auVar54 + auVar64;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uStack_4a8;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar79;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_4b8._8_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar3;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_4b8._0_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar4;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_4a0._8_8_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar5;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_4a0._0_8_;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar6;
      auVar8 = auVar36 * auVar63 + auVar35 * auVar62 + (auVar8 >> 0x34);
      (r->z).n[0] = uVar71 & 0xfffffffffffff;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = auVar8._0_8_;
      (r->z).n[1] = auVar64._0_8_ & 0xfffffffffffff;
      auVar9 = auVar37 * ZEXT816(0x1000003d10) +
               auVar34 * auVar61 + auVar32 * auVar59 + auVar33 * auVar60 + (auVar64 >> 0x34);
      auVar11 = auVar9 >> 0x34;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = auVar11._0_8_;
      (r->z).n[2] = auVar9._0_8_ & 0xfffffffffffff;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = auVar8._8_8_;
      auVar65._8_8_ = auVar11._8_8_;
      auVar65._0_8_ = auVar10._0_8_ & 0xfffffffffffff;
      auVar66 = auVar38 * ZEXT816(0x1000003d10000) + auVar65 + auVar66;
      uVar79 = auVar66._0_8_;
      (r->z).n[3] = uVar79 & 0xfffffffffffff;
      (r->z).n[4] = (auVar66._8_8_ << 0xc | uVar79 >> 0x34) + (auVar89._0_8_ & 0xffffffffffff);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}